

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O3

int uv_poll_init(uv_loop_t *loop,uv_poll_t *handle,int fd)

{
  long *plVar1;
  int iVar2;
  
  iVar2 = uv__io_check_fd(loop,fd);
  if (iVar2 == 0) {
    iVar2 = uv__nonblock_ioctl(fd,1);
    if (iVar2 == -0x19) {
      iVar2 = uv__nonblock_fcntl(fd,1);
    }
    if (iVar2 == 0) {
      handle->loop = loop;
      handle->type = UV_POLL;
      handle->flags = 0x2000;
      handle->handle_queue[0] = loop->handle_queue;
      plVar1 = (long *)loop->handle_queue[1];
      handle->handle_queue[1] = plVar1;
      *plVar1 = (long)handle->handle_queue;
      loop->handle_queue[1] = handle->handle_queue;
      iVar2 = 0;
      handle->next_closing = (uv_handle_t *)0x0;
      uv__io_init(&handle->io_watcher,uv__poll_io,fd);
      handle->poll_cb = (uv_poll_cb)0x0;
    }
  }
  return iVar2;
}

Assistant:

int uv_poll_init(uv_loop_t* loop, uv_poll_t* handle, int fd) {
  int err;

  err = uv__io_check_fd(loop, fd);
  if (err)
    return err;

  /* If ioctl(FIONBIO) reports ENOTTY, try fcntl(F_GETFL) + fcntl(F_SETFL).
   * Workaround for e.g. kqueue fds not supporting ioctls.
   */
  err = uv__nonblock(fd, 1);
  if (err == -ENOTTY)
    if (uv__nonblock == uv__nonblock_ioctl)
      err = uv__nonblock_fcntl(fd, 1);

  if (err)
    return err;

  uv__handle_init(loop, (uv_handle_t*) handle, UV_POLL);
  uv__io_init(&handle->io_watcher, uv__poll_io, fd);
  handle->poll_cb = NULL;
  return 0;
}